

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O1

auto_ptr<avro::OutputStream> __thiscall
avro::parsing::generate
          (parsing *this,Encoder *e,char *calls,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  double dVar1;
  size_t sVar2;
  long lVar3;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  string *s;
  string *extraout_RDX_07;
  string *extraout_RDX_08;
  string *extraout_RDX_09;
  string *extraout_RDX_10;
  string *extraout_RDX_11;
  string *extraout_RDX_12;
  string *extraout_RDX_13;
  ulong uVar4;
  byte *pbVar5;
  pointer s_00;
  char c;
  byte local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  OutputStream *local_90;
  undefined **local_88;
  undefined **local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined8 *local_68;
  char *local_60;
  assertion_result local_58;
  const_string local_40;
  
  sVar2 = strlen(calls);
  s_00 = (values->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  avro::memoryOutputStream((ulong)this);
  local_90 = (OutputStream *)this;
  (**(code **)(*(long *)e + 0x10))(e);
  if (sVar2 != 0) {
    pbVar5 = (byte *)(calls + sVar2);
    local_80 = &PTR__lazy_ostream_001d7bc8;
    local_88 = &PTR__lazy_ostream_001d7b88;
    s = extraout_RDX;
    do {
      local_b1 = *calls;
      calls = (char *)((byte *)calls + 1);
      if (0x72 < local_b1) {
        if (local_b1 == 0x73) {
          lVar3 = 0x98;
        }
        else if (local_b1 == 0x7b) {
          lVar3 = 0x80;
        }
        else {
          if (local_b1 != 0x7d) goto switchD_00173976_caseD_43;
          lVar3 = 0x88;
        }
        goto LAB_00173bb5;
      }
      switch(local_b1) {
      case 0x42:
        from_string<bool>(s_00);
        (**(code **)(*(long *)e + 0x28))(e);
        s = extraout_RDX_03;
        break;
      default:
switchD_00173976_caseD_43:
        boost::unit_test::anon_unknown_0::s_log_impl();
        std::__cxx11::string::_M_replace
                  (0x1dc2b0,0,
                   (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                           m_message._M_string_length,0x1b0701);
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin
             = 
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
        ;
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
             "";
        boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x12d;
        local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
        local_58.m_message.px = (element_type *)0x0;
        local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_70 = 0;
        local_78 = local_80;
        local_68 = &boost::unit_test::lazy_ostream::inst;
        local_60 = "Unknown mnemonic: ";
        local_b0._M_string_length._0_1_ = 0;
        local_b0._M_dataplus._M_p = (pointer)local_88;
        local_b0.field_2._M_allocated_capacity = (size_type)&local_78;
        local_b0.field_2._8_8_ = &local_b1;
        local_40.m_begin =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
        ;
        local_40.m_end = "";
        boost::test_tools::tt_detail::report_assertion
                  (&local_58,(lazy_ostream *)&local_b0,&local_40,0x12d,REQUIRE,CHECK_MSG,0);
        boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
        s = extraout_RDX_10;
        goto LAB_00173bbe;
      case 0x44:
        dVar1 = from_string<double>(s_00);
        (**(code **)(*(long *)e + 0x48))(SUB84(dVar1,0),e);
        s = extraout_RDX_05;
        break;
      case 0x46:
        from_string<float>(s_00);
        (**(code **)(*(long *)e + 0x40))(e);
        s = extraout_RDX_04;
        break;
      case 0x49:
        from_string<int>(s_00);
        (**(code **)(*(long *)e + 0x30))(e);
        s = extraout_RDX_08;
        break;
      case 0x4b:
      case 0x53:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        from_string<std::__cxx11::string>(&local_b0,(parsing *)s_00,s);
        (**(code **)(*(long *)e + 0x50))(e);
        s = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) break;
        uVar4 = local_b0.field_2._M_allocated_capacity + 1;
        goto LAB_00173b52;
      case 0x4c:
        from_string<long>(s_00);
        (**(code **)(*(long *)e + 0x38))(e);
        s = extraout_RDX_02;
        break;
      case 0x4e:
        lVar3 = 0x20;
        goto LAB_00173bb5;
      case 0x55:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        (**(code **)(*(long *)e + 0xa0))(e);
        s = extraout_RDX_12;
        goto LAB_00173bbe;
      case 0x5b:
        lVar3 = 0x70;
        goto LAB_00173bb5;
      case 0x5d:
        lVar3 = 0x78;
LAB_00173bb5:
        (**(code **)(*(long *)e + lVar3))(e);
        s = extraout_RDX_09;
        goto LAB_00173bbe;
      case 0x62:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,
                   (parsing *)s_00,s);
        local_78 = (undefined **)((ulong)local_78 & 0xffffffffffffff00);
        (**(code **)(*(long *)e + 0x58))(e);
        s = extraout_RDX_01;
        goto LAB_00173b40;
      case 99:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        (**(code **)(*(long *)e + 0x90))(e);
        s = extraout_RDX_13;
        goto LAB_00173bbe;
      case 0x65:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        (**(code **)(*(long *)e + 0x68))(e);
        s = extraout_RDX_11;
        goto LAB_00173bbe;
      case 0x66:
        if (calls < pbVar5) {
          do {
            if (9 < (int)*calls - 0x30U) break;
            calls = (char *)((byte *)calls + 1);
          } while ((byte *)calls != pbVar5);
        }
        from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,
                   (parsing *)s_00,s);
        (**(code **)(*(long *)e + 0x60))
                  (e,local_b0._M_dataplus._M_p,
                   CONCAT71(local_b0._M_string_length._1_7_,(undefined1)local_b0._M_string_length) -
                   (long)local_b0._M_dataplus._M_p);
        s = extraout_RDX_06;
LAB_00173b40:
        if ((undefined **)local_b0._M_dataplus._M_p != (undefined **)0x0) {
          uVar4 = local_b0.field_2._M_allocated_capacity - (long)local_b0._M_dataplus._M_p;
LAB_00173b52:
          operator_delete(local_b0._M_dataplus._M_p,uVar4);
          s = extraout_RDX_07;
        }
      }
      s_00 = s_00 + 1;
LAB_00173bbe:
    } while ((byte *)calls != pbVar5);
  }
  (**(code **)(*(long *)e + 0x18))(e);
  return (auto_ptr<avro::OutputStream>)local_90;
}

Assistant:

static auto_ptr<OutputStream> generate(Encoder& e, const char* calls,
    const vector<string>& values)
{
    Scanner sc(calls);
    vector<string>::const_iterator it = values.begin();
    auto_ptr<OutputStream> ob = memoryOutputStream();
    e.init(*ob);

    while (! sc.isDone()) {
        char c = sc.advance();

        switch (c) {
        case 'N':
            e.encodeNull();
            break;
        case 'B':
            e.encodeBool(from_string<bool>(*it++));
            break;
        case 'I':
            e.encodeInt(from_string<int32_t>(*it++));
            break;
        case 'L':
            e.encodeLong(from_string<int64_t>(*it++));
            break;
        case 'F':
            e.encodeFloat(from_string<float>(*it++));
            break;
        case 'D':
            e.encodeDouble(from_string<double>(*it++));
            break;
        case 'S':
        case 'K':
            sc.extractInt();
            e.encodeString(from_string<string>(*it++));
            break;
        case 'b':
            sc.extractInt();
            e.encodeBytes(from_string<vector<uint8_t> >(*it++));
            break;
        case 'f':
            sc.extractInt();
            e.encodeFixed(from_string<vector<uint8_t> >(*it++));
            break;
        case 'e':
            e.encodeEnum(sc.extractInt());
            break;
        case '[':
            e.arrayStart();
            break;
        case ']':
            e.arrayEnd();
            break;
        case '{':
            e.mapStart();
            break;
        case '}':
            e.mapEnd();
            break;
        case 'c':
            e.setItemCount(sc.extractInt());
            break;
        case 's':
            e.startItem();
            break;
        case 'U':
            e.encodeUnionIndex(sc.extractInt());
            break;
        default:
            BOOST_FAIL("Unknown mnemonic: " << c);
        }
    }
    e.flush();
    return ob;
}